

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strerror.c
# Opt level: O0

char * curl_multi_strerror(CURLMcode error)

{
  char *pcStack_10;
  CURLMcode error_local;
  
  switch(error) {
  case CURLM_OK:
    pcStack_10 = "No error";
    break;
  case CURLM_BAD_HANDLE:
    pcStack_10 = "Invalid multi handle";
    break;
  case CURLM_BAD_EASY_HANDLE:
    pcStack_10 = "Invalid easy handle";
    break;
  case CURLM_OUT_OF_MEMORY:
    pcStack_10 = "Out of memory";
    break;
  case CURLM_INTERNAL_ERROR:
    pcStack_10 = "Internal error";
    break;
  case CURLM_BAD_SOCKET:
    pcStack_10 = "Invalid socket argument";
    break;
  case CURLM_UNKNOWN_OPTION:
    pcStack_10 = "Unknown option";
    break;
  case CURLM_ADDED_ALREADY:
    pcStack_10 = "The easy handle is already added to a multi handle";
    break;
  case CURLM_LAST:
  default:
    pcStack_10 = "Unknown error";
    break;
  case CURLM_CALL_MULTI_PERFORM:
    pcStack_10 = "Please call curl_multi_perform() soon";
  }
  return pcStack_10;
}

Assistant:

const char *
curl_multi_strerror(CURLMcode error)
{
#ifndef CURL_DISABLE_VERBOSE_STRINGS
  switch (error) {
  case CURLM_CALL_MULTI_PERFORM:
    return "Please call curl_multi_perform() soon";

  case CURLM_OK:
    return "No error";

  case CURLM_BAD_HANDLE:
    return "Invalid multi handle";

  case CURLM_BAD_EASY_HANDLE:
    return "Invalid easy handle";

  case CURLM_OUT_OF_MEMORY:
    return "Out of memory";

  case CURLM_INTERNAL_ERROR:
    return "Internal error";

  case CURLM_BAD_SOCKET:
    return "Invalid socket argument";

  case CURLM_UNKNOWN_OPTION:
    return "Unknown option";

  case CURLM_ADDED_ALREADY:
    return "The easy handle is already added to a multi handle";

  case CURLM_LAST:
    break;
  }

  return "Unknown error";
#else
  if(error == CURLM_OK)
    return "No error";
  else
    return "Error";
#endif
}